

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<kj::HashMap<int,_kj::StringPtr>::Entry_&> __thiscall
kj::
Table<kj::HashMap<int,kj::StringPtr>::Entry,kj::HashIndex<kj::HashMap<int,kj::StringPtr>::Callbacks>>
::find<0ul,int&>(Table<kj::HashMap<int,kj::StringPtr>::Entry,kj::HashIndex<kj::HashMap<int,kj::StringPtr>::Callbacks>>
                 *this,int *params)

{
  long lVar1;
  ArrayPtr<kj::HashMap<int,_kj::StringPtr>::Entry> table;
  HashIndex<kj::HashMap<int,kj::StringPtr>::Callbacks> local_28 [8];
  long local_20;
  
  table.ptr = (StringPtr *)(params + 8);
  table.size_ = *(size_t *)params;
  HashIndex<kj::HashMap<int,kj::StringPtr>::Callbacks>::
  find<kj::HashMap<int,kj::StringPtr>::Entry,int&>
            (local_28,table,
             (int *)(((long)(*(long *)(params + 2) - *(size_t *)params) >> 3) * -0x5555555555555555)
            );
  if (local_28[0] == (HashIndex<kj::HashMap<int,kj::StringPtr>::Callbacks>)0x1) {
    lVar1 = local_20 * 0x18 + *(long *)params;
  }
  else {
    lVar1 = 0;
  }
  *(long *)this = lVar1;
  return (Maybe<kj::HashMap<int,_kj::StringPtr>::Entry_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}